

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O1

void EPD_DrawLine(uint16_t x1,uint16_t y1,uint16_t x2,uint16_t y2,uint8_t color)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined6 in_register_0000000a;
  uint uVar6;
  uint uVar7;
  undefined6 in_register_00000012;
  uint uVar8;
  undefined6 in_register_00000032;
  ulong uVar9;
  undefined6 in_register_0000003a;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint local_38;
  
  uVar10 = CONCAT62(in_register_0000003a,x1);
  uVar9 = CONCAT62(in_register_00000032,y1);
  uVar3 = (int)CONCAT62(in_register_00000012,x2) - (int)uVar10;
  uVar8 = -uVar3;
  if (0 < (int)uVar3) {
    uVar8 = uVar3;
  }
  uVar11 = (int)CONCAT62(in_register_0000000a,y2) - (int)uVar9;
  uVar3 = -uVar11;
  if (0 < (int)uVar11) {
    uVar3 = uVar11;
  }
  uVar12 = 0;
  uVar6 = -(uint)(x2 < x1) | 1;
  uVar11 = -(uint)(y2 < y1) | 1;
  if (uVar8 < uVar3) {
    uVar7 = 0;
    uVar5 = uVar11;
    uVar11 = 0;
    uVar4 = uVar3;
    uVar3 = uVar8;
    local_38 = uVar6;
  }
  else {
    local_38 = 0;
    uVar5 = 0;
    uVar7 = uVar6;
    uVar4 = uVar8;
  }
  uVar8 = uVar4 >> 1;
  uVar6 = ~uVar4;
  do {
    if (((ushort)uVar10 < gstI80DevInfo.usPanelW) && ((ushort)uVar9 < gstI80DevInfo.usPanelH)) {
      gpFrameBuf
      [(ulong)((uint)uVar10 & 0xffff) +
       (ulong)(((uint)uVar9 & 0xffff) * (uint)gstI80DevInfo.usPanelW)] = color;
    }
    uVar13 = uVar4;
    uVar1 = local_38;
    uVar2 = uVar11;
    if (uVar8 + uVar3 < uVar4) {
      uVar13 = uVar12;
      uVar1 = uVar12;
      uVar2 = uVar12;
    }
    uVar8 = (uVar8 + uVar3) - uVar13;
    uVar10 = (ulong)((uint)uVar10 + uVar7 + uVar1);
    uVar9 = (ulong)((uint)uVar9 + uVar5 + uVar2);
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0);
  return;
}

Assistant:

void EPD_DrawLine(uint16_t x1,uint16_t y1,uint16_t x2,uint16_t y2,uint8_t color)
{
	  uint32_t deltax = 0, deltay = 0, x = 0, y = 0, xinc1 = 0, xinc2 = 0, 
	  yinc1 = 0, yinc2 = 0, den = 0, num = 0, num_add = 0, num_pixels = 0, 
	  curpixel = 0;
	  
	  deltax = ABS(x2 - x1);        /* The difference between the x's */
	  deltay = ABS(y2 - y1);        /* The difference between the y's */
	  x = x1;                       /* Start x off at the first pixel */
	  y = y1;                       /* Start y off at the first pixel */
	  
	  if (x2 >= x1)                 /* The x-values are increasing */
	  {
		    xinc1 = 1;
		    xinc2 = 1;
	  }
	  else                          /* The x-values are decreasing */
	  {
		    xinc1 = -1;
		    xinc2 = -1;
	  }
	  
	  if (y2 >= y1)                 /* The y-values are increasing */
	  {
		    yinc1 = 1;
		    yinc2 = 1;
	  }
	  else                          /* The y-values are decreasing */
	  {
		    yinc1 = -1;
		    yinc2 = -1;
	  }
	  
	  if (deltax >= deltay)         /* There is at least one x-value for every y-value */
	  {
		    xinc1 = 0;              /* Don't change the x when numerator >= denominator */
		    yinc2 = 0;              /* Don't change the y for every iteration */
		    den = deltax;
		    num = deltax / 2;
		    num_add = deltay;
		    num_pixels = deltax;    /* There are more x-values than y-values */
	  }
	  else                          /* There is at least one y-value for every x-value */
	  {
		    xinc2 = 0;              /* Don't change the x for every iteration */
		    yinc1 = 0;              /* Don't change the y when numerator >= denominator */
		    den = deltay;
		    num = deltay / 2;
		    num_add = deltax;
		    num_pixels = deltay;    /* There are more y-values than x-values */
	  }
	  
	  for (curpixel = 0; curpixel <= num_pixels; curpixel++)
	  {
		    EPD_DrawPixel(x, y, color);          /* Draw the current pixel */
		    num += num_add;                      /* Increase the numerator by the top of the fraction */
		    if (num >= den)                      /* Check if numerator >= denominator */
		    {
			      num -= den;                    /* Calculate the new numerator value */
			      x += xinc1;                    /* Change the x as appropriate */
			      y += yinc1;                    /* Change the y as appropriate */
		    }
		    x += xinc2;                          /* Change the x as appropriate */
		    y += yinc2;                          /* Change the y as appropriate */
	  }
}